

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cpp
# Opt level: O2

void part_download(string *download_address,string *file_name,Task *task,
                  queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_> *taskMessageQueue)

{
  int iVar1;
  FILE *pFVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Task *task_local;
  char range_string [60];
  
  task_local = task;
  pFVar2 = fopen((file_name->_M_dataplus)._M_p,"rb+");
  fseeko(pFVar2,task->start,0);
  uVar3 = curl_easy_init();
  curl_easy_setopt(uVar3,0x2712,(download_address->_M_dataplus)._M_p);
  sprintf(range_string,"%ld-%ld",task->start,task->end);
  curl_easy_setopt(uVar3,0x2717,range_string);
  curl_easy_setopt(uVar3,0x2714,(task->proxy_server).address._M_dataplus._M_p);
  curl_easy_setopt(uVar3,0x2711,pFVar2);
  curl_easy_setopt(uVar3,0x4efb,progress_callback);
  curl_easy_setopt(uVar3,0x13,100);
  curl_easy_setopt(uVar3,0x14,5);
  curl_easy_setopt(uVar3,0x2749,task);
  curl_easy_setopt(uVar3,0x2b,0);
  iVar1 = curl_easy_perform(uVar3);
  fclose(pFVar2);
  if (iVar1 == 0) {
    task->status = 2;
    curl_easy_getinfo(uVar3,0x600009,&task->speed);
  }
  else {
    task->status = 3;
    pFVar2 = _stderr;
    uVar4 = curl_easy_strerror(iVar1);
    fprintf(pFVar2,"\rerror:%s\n",uVar4);
    task->speed = -1;
  }
  pthread_mutex_lock((pthread_mutex_t *)&messageLock);
  std::deque<Task_*,_std::allocator<Task_*>_>::push_back(&taskMessageQueue->c,&task_local);
  pthread_mutex_unlock((pthread_mutex_t *)&messageLock);
  curl_easy_cleanup(uVar3);
  return;
}

Assistant:

void
part_download(const string &download_address, const string &file_name, Task *task, queue<Task *> *taskMessageQueue) {
    // rb+ explanation: open in this mode, the file won't get destroyed. But it requires a long enough file in advance.
    FILE *file = fopen(file_name.c_str(), "rb+");
    // fseeko can take larger param as position up to 64 bytes integer.
    fseeko(file, task->start, SEEK_SET);
    CURL *curl = curl_easy_init();
    curl_easy_setopt(curl, CURLOPT_URL, download_address.c_str());
    char range_string[60]; // maybe 60 is just enough...
    sprintf(range_string, "%ld-%ld", task->start, task->end);
    curl_easy_setopt(curl, CURLOPT_RANGE, range_string);
    curl_easy_setopt(curl, CURLOPT_PROXY, task->proxy_server.address.c_str());
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, file);
    curl_easy_setopt(curl, CURLOPT_XFERINFOFUNCTION, progress_callback);
    // warning: the download will abort when meet low speed problem.
    curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, LOWEST_SPEED_BPS);
    curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, 5);
    curl_easy_setopt(curl, CURLOPT_XFERINFODATA, task);
    curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0L);
    // bytes per second
    int result = curl_easy_perform(curl);
    fclose(file);
    if (result != CURLE_OK) {
        task->status = STATUS_ERROR;
        fprintf(stderr, "\rerror:%s\n", curl_easy_strerror((CURLcode) result));
        task->speed = -1;// this is not enough. Error handling will happens on the top of these code.
    } else {
        task->status = STATUS_COMPLETE;
        curl_easy_getinfo(curl, CURLINFO_SPEED_DOWNLOAD_T, &(task->speed));
    }
    pthread_mutex_lock(&messageLock);
    taskMessageQueue->push(task);
    pthread_mutex_unlock(&messageLock);
    curl_easy_cleanup(curl);
}